

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void dbgpval(dbgcxdef *ctx,runsdef *val,_func_void_void_ptr_char_ptr_int *dispfn,void *dispctx,
            int showtype)

{
  int iVar1;
  size_t sVar2;
  void *in_RCX;
  _func_void_void_ptr_char_ptr_int *in_RDX;
  uchar *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  dbgcxdef *unaff_retaddr;
  char *typ;
  uchar *p;
  uint len;
  uchar buf [40];
  uint *in_stack_ffffffffffffff68;
  uchar **in_stack_ffffffffffffff70;
  char *local_70;
  int typ_00;
  char *pcVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  dbgcxdef *in_stack_ffffffffffffffa8;
  void *pvVar5;
  _func_void_void_ptr_char_ptr_int *p_Var6;
  
  pcVar3 = &stack0xffffffffffffffa8;
  local_70 = (char *)0x0;
  iVar1 = (int)pcVar3;
  typ_00 = (int)((ulong)pcVar3 >> 0x20);
  switch(*in_RSI) {
  case '\x01':
    sprintf(&stack0xffffffffffffffa8,"%ld",*(undefined8 *)(in_RSI + 8));
    sVar2 = strlen(&stack0xffffffffffffffa8);
    uVar4 = (uint)sVar2;
    local_70 = "number";
    break;
  case '\x02':
    uVar4 = dbgnam(in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),typ_00,
                   iVar1);
    local_70 = "object";
    break;
  case '\x03':
    iVar1 = osrp2(*(void **)(in_RSI + 8));
    uVar4 = iVar1 - 2;
    pcVar3 = (char *)(*(long *)(in_RSI + 8) + 2);
    local_70 = "string";
    break;
  default:
    pcVar3 = "[unknown type]";
    uVar4 = 0xe;
    break;
  case '\x05':
    pcVar3 = "nil";
    uVar4 = 3;
    break;
  case '\a':
    if (in_R8D != 0) {
      (*in_RDX)(in_RCX,"list: ",6);
    }
    (*in_RDX)(in_RCX,"[",1);
    iVar1 = osrp2(*(void **)(in_RSI + 8));
    iVar1 = iVar1 + -2;
    pcVar3 = (char *)(*(long *)(in_RSI + 8) + 2);
    while (iVar1 != 0) {
      dbgpbval(unaff_retaddr,(dattyp)((ulong)in_RDI >> 0x20),in_RSI,in_RDX,in_RCX);
      lstadv(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (iVar1 != 0) {
        (*in_RDX)(in_RCX," ",1);
      }
    }
    (*in_RDX)(in_RCX,"]",1);
    uVar4 = 0;
    break;
  case '\b':
    pcVar3 = "true";
    uVar4 = 4;
    break;
  case '\n':
    uVar4 = dbgnam(in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),typ_00,
                   iVar1);
    local_70 = "function pointer";
    break;
  case '\r':
    uVar4 = dbgnam(in_stack_ffffffffffffffa8,
                   (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),typ_00,
                   iVar1);
    local_70 = "property pointer";
  }
  if ((local_70 == (char *)0x0) || (in_R8D == 0)) {
    if (*in_RSI == '\x03') {
      (*in_RDX)(in_RCX,"\'",1);
    }
  }
  else {
    pvVar5 = in_RCX;
    p_Var6 = in_RDX;
    sVar2 = strlen(local_70);
    (*in_RDX)(in_RCX,local_70,(int)sVar2);
    (*p_Var6)(pvVar5,": ",2);
    in_RCX = pvVar5;
    in_RDX = p_Var6;
  }
  if (uVar4 < 0x28) {
    (&stack0xffffffffffffffa8)[uVar4] = 0;
  }
  if ((*in_RSI == '\r') || (*in_RSI == '\n')) {
    (*in_RDX)(in_RCX,"&",1);
  }
  if (uVar4 != 0) {
    (*in_RDX)(in_RCX,pcVar3,uVar4);
  }
  if ((*in_RSI == '\x03') && ((local_70 == (char *)0x0 || (in_R8D == 0)))) {
    (*in_RDX)(in_RCX,"\'",1);
  }
  return;
}

Assistant:

void dbgpval(dbgcxdef *ctx, runsdef *val,
             void (*dispfn)(void *ctx, const char *str, int strl),
             void *dispctx,
             int showtype)
{
    uchar   buf[TOKNAMMAX + 1];
    uint    len;
    uchar  *p = buf;
    char   *typ = 0;
    
    switch(val->runstyp)
    {
    case DAT_NUMBER:
        sprintf((char *)buf, "%ld", val->runsv.runsvnum);
        len = strlen((char *)buf);
        typ = "number";
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, (char *)buf, TOKSTOBJ, val->runsv.runsvobj);
        typ = "object";
        break;
        
    case DAT_SSTRING:
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        typ = "string";
        break;
        
    case DAT_NIL:
        p = (uchar *)"nil";
        len = 3;
        break;

    case DAT_LIST:
        if (showtype) (*dispfn)(dispctx, "list: ", 6);
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv(&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = (uchar *)"true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        len = dbgnam(ctx, (char *)buf, TOKSTFUNC, val->runsv.runsvobj);
        typ = "function pointer";
        break;
        
    case DAT_PROPNUM:
        len = dbgnam(ctx, (char *)buf, TOKSTPROP, val->runsv.runsvprp);
        typ = "property pointer";
        break;
        
    default:
        p = (uchar *)"[unknown type]";
        len = 14;
        break;
    }

    /* show the type prefix if desired, or add a quote if it's a string */
    if (typ && showtype)
    {
        /* show the type prefix */
        (*dispfn)(dispctx, typ, (int)strlen(typ));
        (*dispfn)(dispctx, ": ", 2);
    }
    else if (val->runstyp == DAT_SSTRING)
    {
        /* it's a string, and we're not showing a type - add a quote */
        (*dispfn)(dispctx, "'", 1);
    }

    /* 
     *   if possible, null-terminate the buffer - do this only if the
     *   length is actually within the buffer, which won't be the case if
     *   the text comes from someplace outside the buffer (which is the
     *   case if it's a string, for example) 
     */
    if (len < sizeof(buf))
        buf[len] = '\0';

    /* display a "&" prefix if it's an address of some kind */
    if (val->runstyp == DAT_PROPNUM || val->runstyp == DAT_FNADDR)
        (*dispfn)(dispctx, "&", 1);

    /* display the text */
    if (len != 0)
        (*dispfn)(dispctx, (char *)p, len);

    /* add a closing quote if it's a string and we showed an open quote */
    if (val->runstyp == DAT_SSTRING && !(typ && showtype))
        (*dispfn)(dispctx, "'", 1);
}